

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOptionCommand.cxx
# Opt level: O2

bool cmOptionCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  string *psVar2;
  bool bVar3;
  bool bVar4;
  PolicyStatus PVar5;
  CacheEntryType CVar6;
  cmValue cVar7;
  cmState *this;
  PolicyID id;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar8;
  ulong uVar9;
  string_view value;
  string_view separator;
  string local_90;
  string initialValue;
  string local_50;
  
  uVar9 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffffc0;
  if (uVar9 == 0x40) {
    bVar3 = false;
    PVar5 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0077,false);
    cmMakefile::GetStateSnapshot(status->Makefile);
    cVar7 = cmStateSnapshot::GetDefinition
                      (&initialValue,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if (PVar5 - NEW < 3) {
      if (cVar7.Value != (string *)0x0) goto LAB_002b7f88;
      bVar3 = false;
    }
    else if (PVar5 == WARN) {
      bVar3 = operator!=(cVar7,(nullptr_t)0x0);
    }
    this = cmMakefile::GetState(status->Makefile);
    cVar7 = cmState::GetCacheEntryValue
                      (this,(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
    if (cVar7.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&initialValue,"Off",(allocator<char> *)&local_90);
      pcVar8 = extraout_RDX_00;
    }
    else {
      CVar6 = cmState::GetCacheEntryType
                        (this,(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start);
      if (CVar6 != UNINITIALIZED) {
        psVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&initialValue,"HELPSTRING",(allocator<char> *)&local_90);
        cmState::SetCacheEntryProperty
                  (this,psVar2,&initialValue,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 1);
        goto LAB_002b7f7e;
      }
      std::__cxx11::string::string((string *)&initialValue,(string *)cVar7.Value);
      pcVar8 = extraout_RDX;
    }
    if ((long)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start == 0x60) {
      std::__cxx11::string::_M_assign((string *)&initialValue);
      pcVar8 = extraout_RDX_01;
    }
    value._M_str = pcVar8;
    value._M_len = (size_t)initialValue._M_dataplus._M_p;
    bVar4 = cmValue::IsOn((cmValue *)initialValue._M_string_length,value);
    pcVar1 = status->Makefile;
    psVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pcVar8 = "OFF";
    if (bVar4) {
      pcVar8 = "ON";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,pcVar8,(allocator<char> *)&local_50);
    cmMakefile::AddCacheDefinition
              (pcVar1,psVar2,&local_90,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,BOOL,false);
    std::__cxx11::string::~string((string *)&local_90);
    PVar5 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0077,false);
    if (PVar5 != NEW) {
      PVar5 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0126,false);
      if (PVar5 == NEW) {
        cmMakefile::GetStateSnapshot(status->Makefile);
        cmStateSnapshot::RemoveDefinition
                  ((cmStateSnapshot *)&local_90,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (bVar3 != false) {
      cmMakefile::GetStateSnapshot(status->Makefile);
      cVar7 = cmStateSnapshot::GetDefinition
                        (&local_90,
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start);
      if (cVar7.Value == (string *)0x0) {
        pcVar1 = status->Makefile;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_50,(cmPolicies *)0x4d,id);
        cmStrCat<std::__cxx11::string,char_const(&)[90],std::__cxx11::string_const&,char_const(&)[3]>
                  (&local_90,&local_50,
                   (char (*) [90])
                   "\nFor compatibility with older versions of CMake, option is clearing the normal variable \'"
                   ,(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start,(char (*) [3])0x69b606);
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
  }
  else {
    separator._M_str = " ";
    separator._M_len = 1;
    cmJoin(&local_90,args,separator,(string_view)ZEXT816(0));
    cmStrCat<char_const(&)[44],std::__cxx11::string>
              (&initialValue,(char (*) [44])"called with incorrect number of arguments: ",&local_90)
    ;
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
LAB_002b7f7e:
  std::__cxx11::string::~string((string *)&initialValue);
LAB_002b7f88:
  return uVar9 == 0x40;
}

Assistant:

bool cmOptionCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  const bool argError = (args.size() < 2) || (args.size() > 3);
  if (argError) {
    std::string m = cmStrCat("called with incorrect number of arguments: ",
                             cmJoin(args, " "));
    status.SetError(m);
    return false;
  }

  // Determine the state of the option policy
  bool checkAndWarn = false;
  {
    auto policyStatus =
      status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0077);
    const auto& existsBeforeSet =
      status.GetMakefile().GetStateSnapshot().GetDefinition(args[0]);
    switch (policyStatus) {
      case cmPolicies::WARN:
        checkAndWarn = (existsBeforeSet != nullptr);
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW: {
        // See if a local variable with this name already exists.
        // If so we ignore the option command.
        if (existsBeforeSet) {
          return true;
        }
      } break;
    }
  }

  // See if a cache variable with this name already exists
  // If so just make sure the doc state is correct
  cmState* state = status.GetMakefile().GetState();
  cmValue existingValue = state->GetCacheEntryValue(args[0]);
  if (existingValue &&
      (state->GetCacheEntryType(args[0]) != cmStateEnums::UNINITIALIZED)) {
    state->SetCacheEntryProperty(args[0], "HELPSTRING", args[1]);
    return true;
  }

  // Nothing in the cache so add it
  std::string initialValue = existingValue ? *existingValue : "Off";
  if (args.size() == 3) {
    initialValue = args[2];
  }
  bool init = cmIsOn(initialValue);
  status.GetMakefile().AddCacheDefinition(args[0], init ? "ON" : "OFF",
                                          args[1], cmStateEnums::BOOL);
  if (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0077) !=
        cmPolicies::NEW &&
      status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0126) ==
        cmPolicies::NEW) {
    // if there was a definition then remove it
    status.GetMakefile().GetStateSnapshot().RemoveDefinition(args[0]);
  }

  if (checkAndWarn) {
    const auto& existsAfterSet =
      status.GetMakefile().GetStateSnapshot().GetDefinition(args[0]);
    if (!existsAfterSet) {
      status.GetMakefile().IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0077),
                 "\n"
                 "For compatibility with older versions of CMake, option "
                 "is clearing the normal variable '",
                 args[0], "'."));
    }
  }
  return true;
}